

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DivideTest.h
# Opt level: O3

void run_test<unsigned_int>(void)

{
  size_t sVar1;
  char msg [64];
  DivideTest<unsigned_int> local_50;
  char local_48 [64];
  
  snprintf(local_48,0x40,"Testing %s\n","uint32_t");
  sVar1 = strlen(local_48);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,local_48,sVar1);
  local_50.seed = DivideTest<unsigned_int>::randomSeed();
  local_50.rand_n = DivideTest<unsigned_int>::randomSeed();
  DivideTest<unsigned_int>::run(&local_50);
  return;
}

Assistant:

void run_test() {
    char msg[64];
    snprintf(msg, sizeof(msg), "Testing %s\n", type_name<T>::get_name());
    PRINT_INFO(msg);
    DivideTest<T> dt;
    dt.run();
}